

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::OrderedAggregateThresholdSetting::ResetLocal(ClientContext *context)

{
  ClientConfig *pCVar1;
  ClientConfig CStack_1f8;
  
  switchD_014c3389::default(&CStack_1f8,0,0x1e8);
  ClientConfig::ClientConfig(&CStack_1f8);
  pCVar1 = ClientConfig::GetConfig(context);
  pCVar1->ordered_aggregate_threshold = CStack_1f8.ordered_aggregate_threshold;
  ClientConfig::~ClientConfig(&CStack_1f8);
  return;
}

Assistant:

void OrderedAggregateThresholdSetting::ResetLocal(ClientContext &context) {
	ClientConfig::GetConfig(context).ordered_aggregate_threshold = ClientConfig().ordered_aggregate_threshold;
}